

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::parse_month(Datetime *this,Pig *pig,int *value)

{
  bool bVar1;
  size_type previous;
  bool bVar2;
  int month;
  int local_2c;
  
  previous = Pig::cursor(pig);
  bVar1 = Pig::getDigit2(pig,&local_2c);
  bVar2 = local_2c - 1U < 0xc;
  if (bVar2 && bVar1) {
    *value = local_2c;
  }
  else {
    Pig::restoreTo(pig,previous);
  }
  return bVar2 && bVar1;
}

Assistant:

bool Datetime::parse_month (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int month;
  if (pig.getDigit2 (month) &&
      month > 0             &&
      month <= 12)
  {
    value = month;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}